

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O1

int gz_load(gz_statep state,uchar *buf,uint len,uint *have)

{
  uint uVar1;
  int iVar2;
  ssize_t sVar3;
  int *piVar4;
  char *msg;
  int iVar5;
  
  *have = 0;
  do {
    sVar3 = read(state->fd,buf + *have,(ulong)(len - *have));
    iVar2 = (int)sVar3;
    if (iVar2 < 1) break;
    uVar1 = *have;
    *have = uVar1 + iVar2;
  } while (uVar1 + iVar2 < len);
  if (iVar2 < 0) {
    piVar4 = __errno_location();
    msg = strerror(*piVar4);
    iVar5 = -1;
    gz_error(state,-1,msg);
  }
  else {
    iVar5 = 0;
    if (iVar2 == 0) {
      state->eof = 1;
    }
  }
  return iVar5;
}

Assistant:

local int gz_load(gz_statep state, unsigned char *buf, unsigned len, unsigned *have)
{
    int ret;

    *have = 0;
    do {
        ret = read(state->fd, buf + *have, len - *have);
        if (ret <= 0)
            break;
        *have += ret;
    } while (*have < len);
    if (ret < 0) {
        gz_error(state, Z_ERRNO, zstrerror());
        return -1;
    }
    if (ret == 0)
        state->eof = 1;
    return 0;
}